

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O0

result * baryonyx::itm::select_float
                   (result *__return_storage_ptr__,context *ctx,problem *pb,bool is_optimization)

{
  floating_point_type fVar1;
  int f;
  bool is_optimization_local;
  problem *pb_local;
  context *ctx_local;
  
  fVar1 = (ctx->parameters).float_type;
  if (fVar1 == float_type) {
    select_mode<float>(__return_storage_ptr__,ctx,pb,is_optimization);
  }
  else if (fVar1 == double_type) {
    select_mode<double>(__return_storage_ptr__,ctx,pb,is_optimization);
  }
  else {
    select_mode<long_double>(__return_storage_ptr__,ctx,pb,is_optimization);
  }
  return __return_storage_ptr__;
}

Assistant:

static result
select_float(const context& ctx, const problem& pb, bool is_optimization)
{
    const auto f = static_cast<int>(ctx.parameters.float_type);

    if (f == 0)
        return select_mode<float_sel<0>>(ctx, pb, is_optimization);
    else if (f == 1)
        return select_mode<float_sel<1>>(ctx, pb, is_optimization);
    else
        return select_mode<float_sel<2>>(ctx, pb, is_optimization);
}